

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fBooleanStateQueryTests.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Functional::BooleanStateQueryVerifiers::GetFloatVerifier::verifyBoolean
          (GetFloatVerifier *this,TestContext *testCtx,GLenum name,bool reference)

{
  ostringstream *this_00;
  bool bVar1;
  float fVar2;
  StateQueryMemoryWriteGuard<float> state;
  StateQueryMemoryWriteGuard<float> local_1a4;
  undefined1 local_198 [384];
  
  local_1a4.m_preguard = -8.0297587e+18;
  local_1a4.m_value = -8.0297587e+18;
  local_1a4.m_postguard = -8.0297587e+18;
  glu::CallLogWrapper::glGetFloatv
            (&(this->super_StateVerifier).super_CallLogWrapper,name,&local_1a4.m_value);
  bVar1 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<float>::verifyValidity
                    (&local_1a4,testCtx);
  if (bVar1) {
    if (reference) {
      fVar2 = 1.0;
    }
    else {
      fVar2 = 0.0;
    }
    if ((local_1a4.m_value != fVar2) || (NAN(local_1a4.m_value) || NAN(fVar2))) {
      local_198._0_8_ = testCtx->m_log;
      this_00 = (ostringstream *)(local_198 + 8);
      std::__cxx11::ostringstream::ostringstream(this_00);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_00,"// ERROR: expected ",0x13);
      std::ostream::_M_insert<double>((double)fVar2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"; got ",6);
      std::ostream::_M_insert<double>((double)local_1a4.m_value);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(this_00);
      std::ios_base::~ios_base((ios_base *)(local_198 + 0x78));
      if (testCtx->m_testResult == QP_TEST_RESULT_PASS) {
        tcu::TestContext::setTestResult(testCtx,QP_TEST_RESULT_FAIL,"Got invalid float value");
      }
    }
  }
  return;
}

Assistant:

void GetFloatVerifier::verifyBoolean (tcu::TestContext& testCtx, GLenum name, bool reference)
{
	using tcu::TestLog;

	StateQueryMemoryWriteGuard<GLfloat> state;
	glGetFloatv(name, &state);

	if (!state.verifyValidity(testCtx))
		return;

	const GLfloat expectedGLState = reference ? 1.0f : 0.0f;

	if (state != expectedGLState)
	{
		testCtx.getLog() << TestLog::Message << "// ERROR: expected " << expectedGLState << "; got " << state << TestLog::EndMessage;
		if (testCtx.getTestResult() == QP_TEST_RESULT_PASS)
			testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got invalid float value");
	}
}